

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O0

void __thiscall
Js::SourceDynamicProfileManager::AddSavingItem
          (SourceDynamicProfileManager *this,LocalFunctionId functionId,DynamicProfileInfo *info)

{
  OutOfMemoryException *anon_var_0;
  AutoNestedHandledExceptionType local_24;
  DynamicProfileInfo *pDStack_20;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  DynamicProfileInfo *info_local;
  SourceDynamicProfileManager *pSStack_10;
  LocalFunctionId functionId_local;
  SourceDynamicProfileManager *this_local;
  
  pDStack_20 = info;
  info_local._4_4_ = functionId;
  pSStack_10 = this;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_24,ExceptionType_OutOfMemory);
  JsUtil::
  BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Item(&this->dynamicProfileInfoMapSaving,(uint *)((long)&info_local + 4),&stack0xffffffffffffffe0
        );
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_24);
  return;
}

Assistant:

void SourceDynamicProfileManager::AddSavingItem(LocalFunctionId functionId, DynamicProfileInfo *info)
    {
        try
        {
            // our BaseDictionary does not allow nothrow allocator
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_OutOfMemory);
            dynamicProfileInfoMapSaving.Item(functionId, info);
        }
        catch (Js::OutOfMemoryException&)
        {
            Output::Print(_u("Hit OOM while saving dynamic profile info\n"));
        }
    }